

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descramble.cpp
# Opt level: O0

int DSDcc::Descramble::traceBack
              (uchar *out,uchar *m_pathMemory0,uchar *m_pathMemory1,uchar *m_pathMemory2,
              uchar *m_pathMemory3)

{
  int length;
  int loop;
  FEC_STATE state;
  uchar *m_pathMemory3_local;
  uchar *m_pathMemory2_local;
  uchar *m_pathMemory1_local;
  uchar *m_pathMemory0_local;
  uchar *out_local;
  
  length = 0;
  state = S0;
  for (loop = 0x149; -1 < loop; loop = loop + -1) {
    switch(state) {
    case S0:
      if (m_pathMemory0[loop] == '\0') {
        state = S0;
      }
      else {
        state = S2;
      }
      out[loop] = '\0';
      break;
    case S2:
      if (m_pathMemory2[loop] == '\0') {
        state = S1;
      }
      else {
        state = S3;
      }
      out[loop] = '\0';
    }
    length = length + 1;
  }
  return length;
}

Assistant:

int Descramble::traceBack(unsigned char *out,
        unsigned char * m_pathMemory0,
        unsigned char * m_pathMemory1,
        unsigned char * m_pathMemory2,
        unsigned char * m_pathMemory3)
{
    enum FEC_STATE
    {
        S0, S1, S2, S3
    } state;
    int loop;
    int length = 0;

    state = S0;

    for (loop = 329; loop >= 0; loop--, length++)
    {

        switch (state)
        {
        case S0: // if state S0
            if (m_pathMemory0[loop])
            {
                state = S2; // lower path
            }
            else
            {
                state = S0; // upper path
            }
            ; // end else - if
            out[loop] = 0;
            break;

        case S1: // if state S1
            if (m_pathMemory1[loop])
            {
                state = S2; // lower path
            }
            else
            {
                state = S0; // upper path
            }
            ; // end else - if
            out[loop] = 1;
            break;

        case S2: // if state S2
            if (m_pathMemory2[loop])
            {
                state = S3; // lower path
            }
            else
            {
                state = S1; // upper path
            }
            ; // end else - if
            out[loop] = 0;
            break;

        case S3: // if state S3
            if (m_pathMemory3[loop])
            {
                state = S3; // lower path
            }
            else
            {
                state = S1; // upper path
            }
            ; // end else - if
            out[loop] = 1;
            break;

        }; // end switch
    }; // end for

    return (length);
}